

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin_manager.c
# Opt level: O0

int plugin_manager_initialize
              (plugin_manager manager,char *name,char *environment_library_path,
              char *default_library_path,plugin_manager_interface iface,void *impl)

{
  int iVar1;
  size_t sVar2;
  ulong __size;
  void *pvVar3;
  set psVar4;
  char *pcVar5;
  plugin_loader_conflict ppVar6;
  char *in_RCX;
  char *in_RSI;
  long *in_RDI;
  long in_R8;
  long in_R9;
  size_t length;
  dynlink_library_path_str path;
  char name_1 [9];
  size_t name_size;
  set_cb_compare in_stack_ffffffffffffefa0;
  plugin_manager in_stack_ffffffffffffefa8;
  size_t *in_stack_ffffffffffffefc0;
  size_t in_stack_ffffffffffffefc8;
  char *in_stack_ffffffffffffefd0;
  char *in_stack_ffffffffffffefd8;
  size_t *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  
  if (*in_RDI == 0) {
    if (in_RSI == (char *)0x0) {
      log_write_impl_va("metacall",0x3d,"plugin_manager_initialize",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/plugin/source/plugin_manager.c"
                        ,LOG_LEVEL_ERROR,"Invalid plugin manager name");
      return 1;
    }
    sVar2 = strlen(in_RSI);
    __size = sVar2 + 1;
    if (__size < 2) {
      log_write_impl_va("metacall",0x45,"plugin_manager_initialize",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/plugin/source/plugin_manager.c"
                        ,LOG_LEVEL_ERROR,"Invalid plugin manager name length");
      return 1;
    }
    pvVar3 = malloc(__size);
    *in_RDI = (long)pvVar3;
    if (*in_RDI == 0) {
      log_write_impl_va("metacall",0x4e,"plugin_manager_initialize",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/plugin/source/plugin_manager.c"
                        ,LOG_LEVEL_ERROR,"Invalid plugin manager name allocation");
      return 1;
    }
    memcpy((void *)*in_RDI,in_RSI,__size);
  }
  in_RDI[3] = in_R8;
  in_RDI[4] = in_R9;
  if (in_RDI[2] == 0) {
    psVar4 = set_create((set_cb_hash)in_stack_ffffffffffffefa8,in_stack_ffffffffffffefa0);
    in_RDI[2] = (long)psVar4;
    if (in_RDI[2] == 0) {
      log_write_impl_va("metacall",0x61,"plugin_manager_initialize",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/plugin/source/plugin_manager.c"
                        ,LOG_LEVEL_ERROR,"Invalid plugin manager set initialization");
      plugin_manager_destroy((plugin_manager)0x121052);
      return 1;
    }
  }
  if (in_RDI[1] == 0) {
    iVar1 = dynlink_library_path
                      ((dynlink_name)0x6c6c6163617465,
                       (char *)CONCAT17(0x6d,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffa8);
    if (iVar1 != 0) {
      strlen(in_RCX);
    }
    pcVar5 = environment_variable_path_create
                       (in_stack_ffffffffffffefd8,in_stack_ffffffffffffefd0,
                        in_stack_ffffffffffffefc8,in_stack_ffffffffffffefc0);
    in_RDI[1] = (long)pcVar5;
    if (in_RDI[1] == 0) {
      log_write_impl_va("metacall",0x87,"plugin_manager_initialize",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/plugin/source/plugin_manager.c"
                        ,LOG_LEVEL_ERROR,"Invalid plugin manager library path initialization");
      plugin_manager_destroy((plugin_manager)0x121154);
      return 1;
    }
  }
  if (in_RDI[5] == 0) {
    ppVar6 = plugin_loader_create(in_stack_ffffffffffffefa8);
    in_RDI[5] = (long)ppVar6;
    if (in_RDI[5] == 0) {
      log_write_impl_va("metacall",0x9f,"plugin_manager_initialize",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/plugin/source/plugin_manager.c"
                        ,LOG_LEVEL_ERROR,"Invalid plugin manager loader initialization");
      plugin_manager_destroy((plugin_manager)0x1211db);
      return 1;
    }
  }
  return 0;
}

Assistant:

int plugin_manager_initialize(plugin_manager manager, const char *name, const char *environment_library_path, const char *default_library_path, plugin_manager_interface iface, void *impl)
{
	/* Initialize the name */
	if (manager->name == NULL)
	{
		if (name == NULL)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Invalid plugin manager name");
			return 1;
		}

		size_t name_size = strlen(name) + 1;

		if (name_size <= 1)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Invalid plugin manager name length");

			return 1;
		}

		manager->name = malloc(sizeof(char) * name_size);

		if (manager->name == NULL)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Invalid plugin manager name allocation");

			return 1;
		}

		memcpy(manager->name, name, name_size);
	}

	/* Copy manager interface and implementation */
	manager->iface = iface;
	manager->impl = impl;

	/* Allocate the set which maps the plugins by their name */
	if (manager->plugins == NULL)
	{
		manager->plugins = set_create(&hash_callback_str, &comparable_callback_str);

		if (manager->plugins == NULL)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Invalid plugin manager set initialization");

			plugin_manager_destroy(manager);

			return 1;
		}
	}

	/* Initialize the library path */
	if (manager->library_path == NULL)
	{
		const char name[] = "metacall"
#if (!defined(NDEBUG) || defined(DEBUG) || defined(_DEBUG) || defined(__DEBUG) || defined(__DEBUG__))
							"d"
#endif
			;

		dynlink_library_path_str path;
		size_t length = 0;

		/* The order of precedence is:
		* 1) Environment variable
		* 2) Dynamic link library path of the host library
		* 3) Default compile time path
		*/
		if (dynlink_library_path(name, path, &length) == 0)
		{
			default_library_path = path;
		}
		else
		{
			length = strlen(default_library_path);
		}

		manager->library_path = environment_variable_path_create(environment_library_path, default_library_path, length + 1, NULL);

		if (manager->library_path == NULL)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Invalid plugin manager library path initialization");

			plugin_manager_destroy(manager);

			return 1;
		}

		/* On Windows, pass the library path to the loader so it can find the dependencies of the plugins */
		/* For more information: https://github.com/metacall/core/issues/479 */
#if defined(WIN32) || defined(_WIN32)
		if (SetDllDirectoryA(manager->library_path) == FALSE)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Failed to register the DLL directory %s; plugins with other dependant DLLs may fail to load", manager->library_path);
		}
#endif
	}

	/* Initialize the plugin loader */
	if (manager->l == NULL)
	{
		manager->l = plugin_loader_create(manager);

		if (manager->l == NULL)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Invalid plugin manager loader initialization");

			plugin_manager_destroy(manager);

			return 1;
		}
	}

	return 0;
}